

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

bool tfs::subsample(Matrix *dstMatrix,Matrix *srcMatrix,unsigned_long da,unsigned_long db)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  double *pdVar3;
  bool bVar4;
  long lVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  double *pdVar9;
  unsigned_long uVar10;
  ulong uVar11;
  ulong uVar12;
  unsigned_long cc;
  unsigned_long local_68;
  unsigned_long local_50;
  
  uVar1 = dstMatrix->m_a;
  if ((((da + uVar1 <= srcMatrix->m_a) && (uVar6 = dstMatrix->m_d, srcMatrix->m_d == uVar6)) &&
      (uVar2 = dstMatrix->m_c, uVar2 == srcMatrix->m_c)) &&
     (uVar11 = dstMatrix->m_b + db, uVar11 <= srcMatrix->m_b)) {
    if (uVar6 != 0) {
      pdVar3 = srcMatrix->m_data;
      pdVar9 = dstMatrix->m_data;
      if (uVar6 == 1) {
        if (uVar2 != 0) {
          if (uVar2 == 1) {
            local_68 = db;
            if (db < uVar11) {
              do {
                uVar12 = srcMatrix->m_a * local_68 + da;
                if (srcMatrix->m_count <= uVar12) {
                  report_problem("Error",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/Matrix.hpp"
                                 ,"getIndex",0xa0,
                                 "Index out of range: %lu/%lu, a = %lu/%lu, b = %lu/%lu",uVar12,
                                 srcMatrix->m_count,da,srcMatrix->m_a,local_68,srcMatrix->m_b);
                }
                if (uVar1 != 0) {
                  lVar5 = 0;
                  uVar6 = 0;
                  do {
                    pdVar9[uVar6] = pdVar3[uVar12 + uVar6];
                    uVar6 = uVar6 + 1;
                    lVar5 = lVar5 + -8;
                  } while (uVar1 != uVar6);
                  pdVar9 = (double *)((long)pdVar9 - lVar5);
                }
                local_68 = local_68 + 1;
              } while (local_68 != uVar11);
            }
          }
          else {
            uVar6 = 0;
            do {
              uVar10 = db;
              if (db < uVar11) {
                do {
                  uVar12 = srcMatrix->m_ab * uVar6 + da + srcMatrix->m_a * uVar10;
                  if (srcMatrix->m_count <= uVar12) {
                    report_problem("Error",
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/Matrix.hpp"
                                   ,"getIndex",0x96,
                                   "Index out of range: %lu/%lu, a = %lu/%lu, b = %lu/%lu, c = %lu/%lu"
                                   ,uVar12,srcMatrix->m_count,da,srcMatrix->m_a,uVar10,
                                   srcMatrix->m_b,uVar6,srcMatrix->m_c);
                  }
                  if (uVar1 != 0) {
                    lVar5 = 0;
                    uVar8 = 0;
                    do {
                      pdVar9[uVar8] = pdVar3[uVar12 + uVar8];
                      uVar8 = uVar8 + 1;
                      lVar5 = lVar5 + -8;
                    } while (uVar1 != uVar8);
                    pdVar9 = (double *)((long)pdVar9 - lVar5);
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar10 != uVar11);
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 != uVar2);
          }
        }
      }
      else {
        local_50 = 0;
        do {
          if (uVar2 != 0) {
            uVar10 = 0;
            do {
              uVar8 = db;
              if (db < uVar11) {
                do {
                  uVar12 = srcMatrix->m_abc * local_50 + da +
                           srcMatrix->m_a * uVar8 + srcMatrix->m_ab * uVar10;
                  if (srcMatrix->m_count <= uVar12) {
                    report_problem("Error",
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/Matrix.hpp"
                                   ,"getIndex",0x8b,
                                   "Index out of range: %lu/%lu, a = %lu/%lu, b = %lu/%lu, c = %lu/%lu, d = %lu/%lu"
                                   ,uVar12,srcMatrix->m_count,da,srcMatrix->m_a,uVar8,srcMatrix->m_b
                                   ,uVar10,srcMatrix->m_c,local_50,srcMatrix->m_d);
                  }
                  if (uVar1 != 0) {
                    lVar5 = 0;
                    uVar7 = 0;
                    do {
                      pdVar9[uVar7] = pdVar3[uVar12 + uVar7];
                      uVar7 = uVar7 + 1;
                      lVar5 = lVar5 + -8;
                    } while (uVar1 != uVar7);
                    pdVar9 = (double *)((long)pdVar9 - lVar5);
                  }
                  uVar8 = uVar8 + 1;
                } while (uVar8 != uVar11);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar2);
          }
          local_50 = local_50 + 1;
        } while (local_50 != uVar6);
      }
    }
    return true;
  }
  bVar4 = report_problem("Error",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/Matrix.cpp"
                         ,"subsample",0x7c,"Matricies not compatible for subsample.");
  return bVar4;
}

Assistant:

bool
    subsample( Matrix &dstMatrix, const Matrix &srcMatrix, const unsigned long da, const unsigned long db ) {
        const unsigned long srcA  = srcMatrix.aa();     // X
        const unsigned long srcB  = srcMatrix.bb();     // Y
        const unsigned long srcC  = srcMatrix.cc();     // r,g,b channel (if image)
        const unsigned long srcD  = srcMatrix.dd();
        const unsigned long dstA  = dstMatrix.aa();
        const unsigned long dstB  = dstMatrix.bb();
        const unsigned long dstC  = dstMatrix.cc();
        const unsigned long dstD  = dstMatrix.dd();
        if(( dstA + da ) > srcA || (dstB + db ) > srcB || dstC != srcC || srcD != dstD ) {
            return log_error( "Matricies not compatible for subsample." );
        }
        const unsigned long maxB = dstB + db;
        const DNN_NUMERIC  *data = srcMatrix.dataReadOnly();
              DNN_NUMERIC  *dst  = dstMatrix.data();
        if( dstD == 1 ) {
            if( dstC == 1 ) {
                // 2D matrix( aa, bb )
                for( unsigned long bb = db; bb < maxB; bb++ ) {
                    const unsigned long srcIndex = srcMatrix.getIndex( da, bb );    // TODO: Speed up subsample
                    const DNN_NUMERIC *src = &data[srcIndex];
                    for( unsigned long aa = 0; aa < dstA; aa++ ) {
                        *dst++ = *src++;
                    }
                }
                return true;
            }
            // 3D matrix( aa, bb, cc )
            for( unsigned long cc = 0; cc < dstC; cc++ ) {
                for( unsigned long bb = db; bb < maxB; bb++ ) {
                    const unsigned long srcIndex = srcMatrix.getIndex( da, bb, cc );
                    const DNN_NUMERIC *src = &data[srcIndex];
                    for( unsigned long aa = 0; aa < dstA; aa++ ) {
                        *dst++ = *src++;
                    }
                }
            }
            return true;
        }
        // 4D matrix( aa, bb, cc, dd )
        for( unsigned long dd = 0; dd < dstD; dd++ ) {
            for( unsigned long cc = 0; cc < dstC; cc++ ) {
                for( unsigned long bb = db; bb < maxB; bb++ ) {
                    const unsigned long srcIndex = srcMatrix.getIndex( da, bb, cc, dd );
                    const DNN_NUMERIC *src = &data[srcIndex];
                    for( unsigned long aa = 0; aa < dstA; aa++ ) {
                        *dst++ = *src++;
                    }
                }
            }
        }
        return true;
    }